

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

void __thiscall
cmCTestBuildHandler::GenerateXMLLogScraped(cmCTestBuildHandler *this,cmXMLWriter *xml)

{
  cmCTest *this_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  string *psVar6;
  bool local_30a;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8 [32];
  long local_188;
  size_type p;
  RegularExpression *local_160;
  RegularExpression *re;
  cmCTestCompileErrorWarningRex *rit;
  iterator __end3;
  iterator __begin3;
  vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
  *__range3;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  reference local_c0;
  cmCTestBuildErrorWarning *cm;
  cmCTestBuildErrorWarning *local_b0;
  string local_a8;
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  string srcdir;
  int numWarningsAllowed;
  int numErrorsAllowed;
  iterator it;
  vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
  *ew;
  cmXMLWriter *xml_local;
  cmCTestBuildHandler *this_local;
  
  it._M_current = (cmCTestBuildErrorWarning *)&this->ErrorsAndWarnings;
  __gnu_cxx::
  __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
  ::__normal_iterator((__normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                       *)&numWarningsAllowed);
  srcdir.field_2._12_4_ = this->MaxErrors;
  srcdir.field_2._8_4_ = this->MaxWarnings;
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"SourceDirectory",&local_71);
  cmCTest::GetCTestConfiguration((string *)local_50,this_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  cmsys::SystemTools::CollapseFullPath(&local_a8,(string *)local_50);
  std::__cxx11::string::operator=((string *)local_50,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::operator+=((string *)local_50,"/");
  local_b0 = (cmCTestBuildErrorWarning *)
             std::
             vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
             ::begin(it._M_current);
  _numWarningsAllowed = (iterator)local_b0;
  do {
    cm = (cmCTestBuildErrorWarning *)
         std::
         vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
         ::end(it._M_current);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                        *)&numWarningsAllowed,
                       (__normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                        *)&cm);
    local_30a = false;
    if (bVar1) {
      local_30a = srcdir.field_2._12_4_ != 0 || srcdir.field_2._8_4_ != 0;
    }
    if (!local_30a) {
      std::__cxx11::string::~string((string *)local_50);
      return;
    }
    local_c0 = __gnu_cxx::
               __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
               ::operator*((__normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                            *)&numWarningsAllowed);
    if ((((local_c0->Error & 1U) != 0) && (srcdir.field_2._12_4_ != 0)) ||
       (((local_c0->Error & 1U) == 0 && (srcdir.field_2._8_4_ != 0)))) {
      if ((local_c0->Error & 1U) == 0) {
        srcdir.field_2._8_4_ = srcdir.field_2._8_4_ + -1;
      }
      else {
        srcdir.field_2._12_4_ = srcdir.field_2._12_4_ + -1;
      }
      pcVar3 = "Warning";
      if ((local_c0->Error & 1U) != 0) {
        pcVar3 = "Error";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,pcVar3,&local_e1);
      cmXMLWriter::StartElement(xml,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator(&local_e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"BuildLogLine",&local_109);
      cmXMLWriter::Element<int>(xml,&local_108,&local_c0->LogLine);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator(&local_109);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"Text",(allocator<char> *)((long)&__range3 + 7));
      cmXMLWriter::Element<std::__cxx11::string>(xml,&local_130,&local_c0->Text);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
      __end3 = std::
               vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
               ::begin(&this->ErrorWarningFileLineRegex);
      rit = (cmCTestCompileErrorWarningRex *)
            std::
            vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
            ::end(&this->ErrorWarningFileLineRegex);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex_*,_std::vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>_>
                                         *)&rit), bVar1) {
        re = (RegularExpression *)
             __gnu_cxx::
             __normal_iterator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex_*,_std::vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>_>
             ::operator*(&__end3);
        local_160 = &((reference)re)->RegularExpression;
        bVar1 = cmsys::RegularExpression::find(local_160,&local_c0->Text);
        if (bVar1) {
          cmsys::RegularExpression::match_abi_cxx11_
                    ((string *)&p,local_160,*(int *)(re->regmatch).startp);
          std::__cxx11::string::operator=((string *)&local_c0->SourceFile,(string *)&p);
          std::__cxx11::string::~string((string *)&p);
          cmsys::SystemTools::ConvertToUnixSlashes(&local_c0->SourceFile);
          lVar4 = std::__cxx11::string::find((char *)&local_c0->SourceFile,0x846498);
          if (lVar4 == -1) {
            cmsys::SystemTools::CollapseFullPath(&local_1c8,&local_c0->SourceFile);
            std::__cxx11::string::operator=((string *)&local_c0->SourceFile,(string *)&local_1c8);
            std::__cxx11::string::~string((string *)&local_1c8);
            psVar6 = &local_c0->SourceFile;
            pcVar3 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(psVar6,pcVar3,"");
          }
          else {
            cmsys::SystemTools::ReplaceString(&local_c0->SourceFile,"/.../","");
            local_188 = std::__cxx11::string::find((char)local_c0 + '(',0x2f);
            if (local_188 != -1) {
              psVar6 = &local_c0->SourceFile;
              std::__cxx11::string::size();
              std::__cxx11::string::substr((ulong)local_1a8,(ulong)psVar6);
              std::__cxx11::string::operator=((string *)&local_c0->SourceFile,local_1a8);
              std::__cxx11::string::~string(local_1a8);
            }
          }
          cmsys::RegularExpression::match_abi_cxx11_
                    (&local_1e8,local_160,*(int *)((long)(re->regmatch).startp + 4));
          pcVar3 = (char *)std::__cxx11::string::c_str();
          iVar2 = atoi(pcVar3);
          local_c0->LineNumber = iVar2;
          std::__cxx11::string::~string((string *)&local_1e8);
          break;
        }
        __gnu_cxx::
        __normal_iterator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex_*,_std::vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>_>
        ::operator++(&__end3);
      }
      uVar5 = std::__cxx11::string::empty();
      if (((uVar5 & 1) == 0) && (-1 < local_c0->LineNumber)) {
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_208,"SourceFile",&local_209);
          cmXMLWriter::Element<std::__cxx11::string>(xml,&local_208,&local_c0->SourceFile);
          std::__cxx11::string::~string((string *)&local_208);
          std::allocator<char>::~allocator(&local_209);
        }
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_230,"SourceFileTail",&local_231);
          cmXMLWriter::Element<std::__cxx11::string>(xml,&local_230,&local_c0->SourceFileTail);
          std::__cxx11::string::~string((string *)&local_230);
          std::allocator<char>::~allocator(&local_231);
        }
        if (-1 < local_c0->LineNumber) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_258,"SourceLineNumber",&local_259);
          cmXMLWriter::Element<int>(xml,&local_258,&local_c0->LineNumber);
          std::__cxx11::string::~string((string *)&local_258);
          std::allocator<char>::~allocator(&local_259);
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,"PreContext",&local_281);
      cmXMLWriter::Element<std::__cxx11::string>(xml,&local_280,&local_c0->PreContext);
      std::__cxx11::string::~string((string *)&local_280);
      std::allocator<char>::~allocator(&local_281);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a8,"PostContext",&local_2a9);
      cmXMLWriter::StartElement(xml,&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::allocator<char>::~allocator(&local_2a9);
      cmXMLWriter::Content<std::__cxx11::string>(xml,&local_c0->PostContext);
      if ((((local_c0->Error & 1U) != 0) && (srcdir.field_2._12_4_ == 0)) ||
         (((local_c0->Error & 1U) == 0 && (srcdir.field_2._8_4_ == 0)))) {
        cmXMLWriter::Content<char[72]>
                  (xml,(char (*) [72])
                       "\nThe maximum number of reported warnings or errors has been reached!!!\n");
      }
      cmXMLWriter::EndElement(xml);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d0,"RepeatCount",&local_2d1);
      cmXMLWriter::Element<char[2]>(xml,&local_2d0,(char (*) [2])0x8a593e);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::allocator<char>::~allocator(&local_2d1);
      cmXMLWriter::EndElement(xml);
    }
    __gnu_cxx::
    __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
    ::operator++((__normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                  *)&numWarningsAllowed,0);
  } while( true );
}

Assistant:

void cmCTestBuildHandler::GenerateXMLLogScraped(cmXMLWriter& xml)
{
  std::vector<cmCTestBuildErrorWarning>& ew = this->ErrorsAndWarnings;
  std::vector<cmCTestBuildErrorWarning>::iterator it;

  // only report the first 50 warnings and first 50 errors
  int numErrorsAllowed = this->MaxErrors;
  int numWarningsAllowed = this->MaxWarnings;
  std::string srcdir = this->CTest->GetCTestConfiguration("SourceDirectory");
  // make sure the source dir is in the correct case on windows
  // via a call to collapse full path.
  srcdir = cmSystemTools::CollapseFullPath(srcdir);
  srcdir += "/";
  for (it = ew.begin();
       it != ew.end() && (numErrorsAllowed || numWarningsAllowed); it++) {
    cmCTestBuildErrorWarning* cm = &(*it);
    if ((cm->Error && numErrorsAllowed) ||
        (!cm->Error && numWarningsAllowed)) {
      if (cm->Error) {
        numErrorsAllowed--;
      } else {
        numWarningsAllowed--;
      }
      xml.StartElement(cm->Error ? "Error" : "Warning");
      xml.Element("BuildLogLine", cm->LogLine);
      xml.Element("Text", cm->Text);
      for (cmCTestCompileErrorWarningRex& rit :
           this->ErrorWarningFileLineRegex) {
        cmsys::RegularExpression* re = &rit.RegularExpression;
        if (re->find(cm->Text)) {
          cm->SourceFile = re->match(rit.FileIndex);
          // At this point we need to make this->SourceFile relative to
          // the source root of the project, so cvs links will work
          cmSystemTools::ConvertToUnixSlashes(cm->SourceFile);
          if (cm->SourceFile.find("/.../") != std::string::npos) {
            cmSystemTools::ReplaceString(cm->SourceFile, "/.../", "");
            std::string::size_type p = cm->SourceFile.find('/');
            if (p != std::string::npos) {
              cm->SourceFile =
                cm->SourceFile.substr(p + 1, cm->SourceFile.size() - p);
            }
          } else {
            // make sure it is a full path with the correct case
            cm->SourceFile = cmSystemTools::CollapseFullPath(cm->SourceFile);
            cmSystemTools::ReplaceString(cm->SourceFile, srcdir.c_str(), "");
          }
          cm->LineNumber = atoi(re->match(rit.LineIndex).c_str());
          break;
        }
      }
      if (!cm->SourceFile.empty() && cm->LineNumber >= 0) {
        if (!cm->SourceFile.empty()) {
          xml.Element("SourceFile", cm->SourceFile);
        }
        if (!cm->SourceFileTail.empty()) {
          xml.Element("SourceFileTail", cm->SourceFileTail);
        }
        if (cm->LineNumber >= 0) {
          xml.Element("SourceLineNumber", cm->LineNumber);
        }
      }
      xml.Element("PreContext", cm->PreContext);
      xml.StartElement("PostContext");
      xml.Content(cm->PostContext);
      // is this the last warning or error, if so notify
      if ((cm->Error && !numErrorsAllowed) ||
          (!cm->Error && !numWarningsAllowed)) {
        xml.Content("\nThe maximum number of reported warnings or errors "
                    "has been reached!!!\n");
      }
      xml.EndElement(); // PostContext
      xml.Element("RepeatCount", "0");
      xml.EndElement(); // "Error" / "Warning"
    }
  }
}